

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uts.c
# Opt level: O3

int uts_numChildren_geo(Node *parent)

{
  int iVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  double dVar5;
  
  dVar3 = b_0;
  iVar1 = parent->height;
  dVar5 = b_0;
  if (0 < iVar1) {
    if (shape_fn == FIXED) {
      if (gen_mx <= iVar1) {
        dVar5 = 0.0;
      }
    }
    else if (shape_fn == CYCLIC) {
      dVar5 = 0.0;
      if (iVar1 == gen_mx * 5 || SBORROW4(iVar1,gen_mx * 5) != iVar1 + gen_mx * -5 < 0) {
        dVar5 = sin(((double)iVar1 * 6.283185307179586) / (double)gen_mx);
        dVar5 = pow(dVar3,dVar5);
      }
    }
    else if (shape_fn == EXPDEC) {
      dVar5 = log(b_0);
      dVar2 = log((double)gen_mx);
      dVar5 = pow((double)iVar1,-dVar5 / dVar2);
      dVar5 = dVar5 * dVar3;
    }
    else {
      dVar5 = b_0 * (1.0 - (double)iVar1 / (double)gen_mx);
    }
  }
  uVar4 = rng_rand((parent->state).state);
  if ((int)uVar4 < 0) {
    printf("*** toProb: rand n = %d out of range\n",(ulong)uVar4);
  }
  dVar3 = 1.0;
  if (-1 < (int)uVar4) {
    dVar3 = (double)(int)uVar4 * -4.656612873077393e-10 + 1.0;
  }
  dVar3 = log(dVar3);
  dVar5 = log(1.0 - 1.0 / (dVar5 + 1.0));
  dVar5 = floor(dVar3 / dVar5);
  return (int)dVar5;
}

Assistant:

int uts_numChildren_geo(Node * parent) {
  double b_i = b_0;
  int depth = parent->height;
  int numChildren, h;
  double p, u;
  
  // use shape function to compute target b_i
  if (depth > 0){
    switch (shape_fn) {
      
      // expected size polynomial in depth
    case EXPDEC:
      b_i = b_0 * pow((double) depth, -log(b_0)/log((double) gen_mx));
      break;
      
      // cyclic tree size
    case CYCLIC:
      if (depth > 5 * gen_mx){
        b_i = 0.0;
        break;
      } 
      b_i = pow(b_0, 
                sin(2.0*3.141592653589793*(double) depth / (double) gen_mx));
      break;

      // identical distribution at all nodes up to max depth
    case FIXED:
      b_i = (depth < gen_mx)? b_0 : 0;
      break;
      
      // linear decrease in b_i
    case LINEAR:
    default:
      b_i =  b_0 * (1.0 - (double)depth / (double) gen_mx);
      break;
    }
  }

  // given target b_i, find prob p so expected value of 
  // geometric distribution is b_i.
  p = 1.0 / (1.0 + b_i);

  // get uniform random number on [0,1)
  h = rng_rand(parent->state.state);
  u = rng_toProb(h);

  // max number of children at this cumulative probability
  // (from inverse geometric cumulative density function)
  numChildren = (int) floor(log(1 - u) / log(1 - p)); 

  return numChildren;
}